

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O0

int ConnectLIRMIA3(LIRMIA3 *pLIRMIA3,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  uint local_12c;
  char local_128 [4];
  int channel;
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  LIRMIA3 *pLIRMIA3_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  memset(pLIRMIA3->szCfgFilePath,0,0x100);
  sprintf(pLIRMIA3->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(local_128,0,0x100);
    memset(pLIRMIA3->szDevPath,0,0x100);
    sprintf(pLIRMIA3->szDevPath,"COM1");
    pLIRMIA3->BaudRate = 0x1c200;
    pLIRMIA3->timeout = 1000;
    pLIRMIA3->threadperiod = 0x32;
    pLIRMIA3->bSaveRawData = 1;
    for (local_12c = 0; (int)local_12c < 4; local_12c = local_12c + 1) {
      pLIRMIA3->MinPWs[(int)local_12c] = 1000;
      pLIRMIA3->MidPWs[(int)local_12c] = 0x5dc;
      pLIRMIA3->MaxPWs[(int)local_12c] = 2000;
      pLIRMIA3->InitPWs[(int)local_12c] = 0x5dc;
      pLIRMIA3->ThresholdPWs[(int)local_12c] = 0;
      pLIRMIA3->CoefPWs[(int)local_12c] = 1.0;
      pLIRMIA3->bProportionalPWs[(int)local_12c] = 1;
    }
    pLIRMIA3->rightthrusterchan = 3;
    pLIRMIA3->leftthrusterchan = 2;
    pLIRMIA3->frontthrusterchan = 0;
    pLIRMIA3->rearthrusterchan = 1;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%255s",pLIRMIA3->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pLIRMIA3->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pLIRMIA3->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pLIRMIA3->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pLIRMIA3->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      for (local_12c = 0; (int)local_12c < 4; local_12c = local_12c + 1) {
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pLIRMIA3->MinPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pLIRMIA3->MidPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pLIRMIA3->MaxPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pLIRMIA3->InitPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pLIRMIA3->ThresholdPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pLIRMIA3->CoefPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pLIRMIA3->bProportionalPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pLIRMIA3->rightthrusterchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pLIRMIA3->leftthrusterchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pLIRMIA3->frontthrusterchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pLIRMIA3->rearthrusterchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._248_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pLIRMIA3->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pLIRMIA3->threadperiod = 0x32;
  }
  for (local_12c = 0; (int)local_12c < 4; local_12c = local_12c + 1) {
    if (((((((pLIRMIA3->MinPWs[(int)local_12c] < 500) || (0x9c4 < pLIRMIA3->MinPWs[(int)local_12c]))
           || (pLIRMIA3->MidPWs[(int)local_12c] < 500)) ||
          ((0x9c4 < pLIRMIA3->MidPWs[(int)local_12c] || (pLIRMIA3->MaxPWs[(int)local_12c] < 500))))
         || (0x9c4 < pLIRMIA3->MaxPWs[(int)local_12c])) ||
        ((pLIRMIA3->InitPWs[(int)local_12c] != 0 &&
         (((pLIRMIA3->InitPWs[(int)local_12c] < 500 || (0x9c4 < pLIRMIA3->InitPWs[(int)local_12c]))
          || ((pLIRMIA3->InitPWs[(int)local_12c] < pLIRMIA3->MinPWs[(int)local_12c] ||
              (pLIRMIA3->MaxPWs[(int)local_12c] < pLIRMIA3->InitPWs[(int)local_12c])))))))) ||
       (((pLIRMIA3->MidPWs[(int)local_12c] < pLIRMIA3->MinPWs[(int)local_12c] ||
         (pLIRMIA3->MaxPWs[(int)local_12c] < pLIRMIA3->MidPWs[(int)local_12c])) ||
        (pLIRMIA3->ThresholdPWs[(int)local_12c] < 0)))) {
      printf("Invalid parameters : channel %d.\n",(ulong)local_12c);
      pLIRMIA3->MinPWs[(int)local_12c] = 1000;
      pLIRMIA3->MidPWs[(int)local_12c] = 0x5dc;
      pLIRMIA3->MaxPWs[(int)local_12c] = 2000;
      pLIRMIA3->InitPWs[(int)local_12c] = 0x5dc;
      pLIRMIA3->ThresholdPWs[(int)local_12c] = 0;
      pLIRMIA3->CoefPWs[(int)local_12c] = 1.0;
      pLIRMIA3->bProportionalPWs[(int)local_12c] = 1;
    }
  }
  if ((pLIRMIA3->rightthrusterchan < 0) || (3 < pLIRMIA3->rightthrusterchan)) {
    printf("Invalid parameter : rightthrusterchan.\n");
    pLIRMIA3->rightthrusterchan = 1;
  }
  if ((pLIRMIA3->leftthrusterchan < 0) || (3 < pLIRMIA3->leftthrusterchan)) {
    printf("Invalid parameter : leftthrusterchan.\n");
    pLIRMIA3->leftthrusterchan = 0;
  }
  if ((pLIRMIA3->frontthrusterchan < 0) || (3 < pLIRMIA3->frontthrusterchan)) {
    printf("Invalid parameter : frontthrusterchan.\n");
    pLIRMIA3->frontthrusterchan = 2;
  }
  if ((pLIRMIA3->rearthrusterchan < 0) || (3 < pLIRMIA3->rearthrusterchan)) {
    printf("Invalid parameter : rearthrusterchan.\n");
    pLIRMIA3->rearthrusterchan = 3;
  }
  for (local_12c = 0; (int)local_12c < 4; local_12c = local_12c + 1) {
    pLIRMIA3->LastPWs[(int)local_12c] = 0;
  }
  iVar1 = OpenRS232Port(&pLIRMIA3->RS232Port,pLIRMIA3->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pLIRMIA3->RS232Port,pLIRMIA3->BaudRate,'\0',0,'\b','\0',
                                pLIRMIA3->timeout);
    if (iVar1 == 0) {
      iVar1 = InitLIRMIA3(pLIRMIA3);
      if (iVar1 == 0) {
        printf("LIRMIA3 connected.\n");
        pLIRMIA3_local._4_4_ = 0;
      }
      else {
        printf("Unable to connect to LIRMIA3 : Initialization failure.\n");
        CloseRS232Port(&pLIRMIA3->RS232Port);
        pLIRMIA3_local._4_4_ = 1;
      }
    }
    else {
      printf("Unable to connect to a LIRMIA3.\n");
      CloseRS232Port(&pLIRMIA3->RS232Port);
      pLIRMIA3_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a LIRMIA3.\n");
    pLIRMIA3_local._4_4_ = 1;
  }
  return pLIRMIA3_local._4_4_;
}

Assistant:

inline int ConnectLIRMIA3(LIRMIA3* pLIRMIA3, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	int channel = 0;

	memset(pLIRMIA3->szCfgFilePath, 0, sizeof(pLIRMIA3->szCfgFilePath));
	sprintf(pLIRMIA3->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pLIRMIA3->szDevPath, 0, sizeof(pLIRMIA3->szDevPath));
		sprintf(pLIRMIA3->szDevPath, "COM1");
		pLIRMIA3->BaudRate = 115200;
		pLIRMIA3->timeout = 1000;
		pLIRMIA3->threadperiod = 50;
		pLIRMIA3->bSaveRawData = 1;
		for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
		{
			pLIRMIA3->MinPWs[channel] = 1000;
			pLIRMIA3->MidPWs[channel] = 1500;
			pLIRMIA3->MaxPWs[channel] = 2000;
			pLIRMIA3->InitPWs[channel] = 1500;
			pLIRMIA3->ThresholdPWs[channel] = 0;
			pLIRMIA3->CoefPWs[channel] = 1;
			pLIRMIA3->bProportionalPWs[channel] = 1;
		}
		pLIRMIA3->rightthrusterchan = 3;
		pLIRMIA3->leftthrusterchan = 2;
		pLIRMIA3->frontthrusterchan = 0;
		pLIRMIA3->rearthrusterchan = 1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pLIRMIA3->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->bSaveRawData) != 1) printf("Invalid configuration file.\n");

			for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MinPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MidPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MaxPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->InitPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->ThresholdPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pLIRMIA3->CoefPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->bProportionalPWs[channel]) != 1) printf("Invalid configuration file.\n");
			}

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->rightthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->leftthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->frontthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->rearthrusterchan) != 1) printf("Invalid configuration file.\n");

			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pLIRMIA3->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pLIRMIA3->threadperiod = 50;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		if (
			(pLIRMIA3->MinPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MinPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MidPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MidPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MaxPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MaxPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)
			||(
			(pLIRMIA3->InitPWs[channel] != 0)&&
			((pLIRMIA3->InitPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->InitPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MinPWs[channel] > pLIRMIA3->InitPWs[channel])||(pLIRMIA3->InitPWs[channel] > pLIRMIA3->MaxPWs[channel]))			
			)||
			(pLIRMIA3->MinPWs[channel] > pLIRMIA3->MidPWs[channel])||(pLIRMIA3->MidPWs[channel] > pLIRMIA3->MaxPWs[channel])||
			(pLIRMIA3->ThresholdPWs[channel] < 0)
			)
		{
			printf("Invalid parameters : channel %d.\n", channel);
			pLIRMIA3->MinPWs[channel] = 1000;
			pLIRMIA3->MidPWs[channel] = 1500;
			pLIRMIA3->MaxPWs[channel] = 2000;
			pLIRMIA3->InitPWs[channel] = 1500;
			pLIRMIA3->ThresholdPWs[channel] = 0;
			pLIRMIA3->CoefPWs[channel] = 1;
			pLIRMIA3->bProportionalPWs[channel] = 1;
		}
	}
	if ((pLIRMIA3->rightthrusterchan < 0)||(pLIRMIA3->rightthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : rightthrusterchan.\n");
		pLIRMIA3->rightthrusterchan = 1;
	}
	if ((pLIRMIA3->leftthrusterchan < 0)||(pLIRMIA3->leftthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : leftthrusterchan.\n");
		pLIRMIA3->leftthrusterchan = 0;
	}
	if ((pLIRMIA3->frontthrusterchan < 0)||(pLIRMIA3->frontthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : frontthrusterchan.\n");
		pLIRMIA3->frontthrusterchan = 2;
	}
	if ((pLIRMIA3->rearthrusterchan < 0)||(pLIRMIA3->rearthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : rearthrusterchan.\n");
		pLIRMIA3->rearthrusterchan = 3;
	}

	// Used to save raw data, should be handled specifically...
	//pLIRMIA3->pfSaveFile = NULL;

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		pLIRMIA3->LastPWs[channel] = 0;
	}

	if (OpenRS232Port(&pLIRMIA3->RS232Port, pLIRMIA3->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a LIRMIA3.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pLIRMIA3->RS232Port, pLIRMIA3->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pLIRMIA3->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a LIRMIA3.\n");
		CloseRS232Port(&pLIRMIA3->RS232Port);
		return EXIT_FAILURE;
	}

	if (InitLIRMIA3(pLIRMIA3) != EXIT_SUCCESS)
	{
		printf("Unable to connect to LIRMIA3 : Initialization failure.\n");
		CloseRS232Port(&pLIRMIA3->RS232Port);
		return EXIT_FAILURE;
	}

	printf("LIRMIA3 connected.\n");

	return EXIT_SUCCESS;
}